

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::Implement
          (Implement *this,IOSystem *pIOHandler,char *pFilename,char *pMode)

{
  int iVar1;
  unzFile pvVar2;
  undefined1 local_68 [8];
  zlib_filefunc_def mapping;
  char *pMode_local;
  char *pFilename_local;
  IOSystem *pIOHandler_local;
  Implement *this_local;
  
  this->m_ZipFileHandle = (unzFile)0x0;
  mapping.opaque = pMode;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
  ::map(&this->m_ArchiveMap);
  iVar1 = strcmp((char *)mapping.opaque,"r");
  if (iVar1 != 0) {
    __assert_fail("strcmp(pMode, \"r\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x150,
                  "Assimp::ZipArchiveIOSystem::Implement::Implement(IOSystem *, const char *, const char *)"
                 );
  }
  if (pFilename == (char *)0x0) {
    __assert_fail("pFilename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x151,
                  "Assimp::ZipArchiveIOSystem::Implement::Implement(IOSystem *, const char *, const char *)"
                 );
  }
  if (*pFilename != '\0') {
    IOSystem2Unzip::get((zlib_filefunc_def *)local_68,pIOHandler);
    pvVar2 = (unzFile)unzOpen2(pFilename,(zlib_filefunc_def *)local_68);
    this->m_ZipFileHandle = pvVar2;
  }
  return;
}

Assistant:

ZipArchiveIOSystem::Implement::Implement(IOSystem* pIOHandler, const char* pFilename, const char* pMode) {
        ai_assert(strcmp(pMode, "r") == 0);
        ai_assert(pFilename != nullptr);
        if (pFilename[0] == 0)
            return;

        zlib_filefunc_def mapping = IOSystem2Unzip::get(pIOHandler);
        m_ZipFileHandle = unzOpen2(pFilename, &mapping);
    }